

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O0

void __thiscall TCPConnection::Close(TCPConnection *this)

{
  TCPConnection *this_local;
  
  switch(this->State) {
  case CLOSED:
    break;
  case LISTEN:
  case SYN_SENT:
    this->State = CLOSED;
    break;
  case SYN_RECEIVED:
  case ESTABLISHED:
    SendFlags(this,'\x01');
    this->State = FIN_WAIT_1;
    this->SequenceNumber = this->SequenceNumber + 1;
    break;
  case FIN_WAIT_1:
    break;
  case FIN_WAIT_2:
    break;
  case CLOSE_WAIT:
    SendFlags(this,'\x01');
    this->SequenceNumber = this->SequenceNumber + 1;
    this->State = LAST_ACK;
    break;
  case CLOSING:
    break;
  case LAST_ACK:
    break;
  case TIMED_WAIT:
    break;
  case TTCP_PERSIST:
  }
  return;
}

Assistant:

void TCPConnection::Close()
{
    switch (State)
    {
    case LISTEN:
    case SYN_SENT: State = CLOSED; break;
    case SYN_RECEIVED:
    case ESTABLISHED:
        SendFlags(FLAG_FIN);
        State = FIN_WAIT_1;
        SequenceNumber++; // FIN consumes a sequence number
        break;
    case CLOSE_WAIT:
        SendFlags(FLAG_FIN);
        SequenceNumber++; // FIN consumes a sequence number
        State = LAST_ACK;
        break;
    case CLOSED: break;
    case FIN_WAIT_1: break;
    case FIN_WAIT_2: break;
    case CLOSING: break;
    case LAST_ACK: break;
    case TIMED_WAIT: break;
    case TTCP_PERSIST: break;
    }
}